

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# experiment_helpers.cpp
# Opt level: O2

void opengv::generateRandom3D3DCorrespondences
               (translation_t *position1,rotation_t *rotation1,translation_t *position2,
               rotation_t *rotation2,size_t numberPoints,double noise,double outlierFraction,
               bearingVectors_t *points1,bearingVectors_t *points2,MatrixXd *gt)

{
  pointer pMVar1;
  undefined1 auVar2 [16];
  PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *pPVar3;
  size_t i;
  PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *pPVar4;
  long lVar5;
  vector<Eigen::Matrix<double,3,1,0,3,1>,Eigen::aligned_allocator<Eigen::Matrix<double,3,1,0,3,1>>>
  *this;
  size_t i_1;
  long lVar6;
  bool bVar7;
  undefined1 auVar8 [16];
  undefined1 in_XMM2 [16];
  point_t p;
  undefined1 local_d0 [24];
  MatrixXd *local_b8;
  variable_if_dynamic<long,__1> local_b0;
  variable_if_dynamic<long,__1> local_a8;
  PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *local_a0;
  RhsNested local_98;
  translation_t *local_90;
  vector<Eigen::Matrix<double,3,1,0,3,1>,Eigen::aligned_allocator<Eigen::Matrix<double,3,1,0,3,1>>>
  *local_80;
  translation_t *local_78;
  rotation_t *local_70;
  size_t local_68;
  double local_60;
  translation_t *local_58;
  rotation_t *local_50;
  PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> local_48 [24];
  
  local_80 = (vector<Eigen::Matrix<double,3,1,0,3,1>,Eigen::aligned_allocator<Eigen::Matrix<double,3,1,0,3,1>>>
              *)points1;
  local_78 = position2;
  local_70 = rotation2;
  local_68 = numberPoints;
  local_60 = outlierFraction;
  local_58 = position1;
  local_50 = rotation1;
  for (pPVar4 = (PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *)0x0;
      pPVar3 = (PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *)
               (gt->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
               m_cols, pPVar4 < pPVar3; pPVar4 = pPVar4 + 1) {
    generateRandomPoint((Vector3d *)local_48,8.0,4.0);
    local_d0._8_8_ =
         (gt->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_rows;
    local_d0._0_8_ =
         (gt->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_data +
         local_d0._8_8_ * (long)pPVar4;
    local_b8 = gt;
    local_b0.m_value = 0;
    local_a8.m_value = (long)pPVar4;
    local_a0 = (PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *)local_d0._8_8_;
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,1,true>,Eigen::Matrix<double,3,1,0,3,1>>
              ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true> *)local_d0,
               (Matrix<double,_3,_1,_0,_3,_1> *)local_48);
  }
  lVar5 = 0;
  this = local_80;
  for (pPVar4 = (PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *)0x0; pPVar4 < pPVar3;
      pPVar4 = pPVar4 + 1) {
    local_d0._16_8_ =
         (gt->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_rows;
    local_d0._8_8_ =
         (gt->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_data +
         local_d0._16_8_ * (long)pPVar4;
    local_d0._0_8_ = local_50;
    local_b0.m_value = (long)gt;
    local_a8.m_value = 0;
    local_90 = local_58;
    local_a0 = pPVar4;
    local_98 = (RhsNested)local_d0._16_8_;
    Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
    _set_noalias<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,3,3,0,3,3>const>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,1,true>const,Eigen::Matrix<double,3,1,0,3,1>const>,0>>
              (local_48,(DenseBase<Eigen::Product<Eigen::Transpose<const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_0>_>
                         *)local_d0);
    std::
    vector<Eigen::Matrix<double,3,1,0,3,1>,Eigen::aligned_allocator<Eigen::Matrix<double,3,1,0,3,1>>>
    ::emplace_back<Eigen::Matrix<double,3,1,0,3,1>>(this,(Matrix<double,_3,_1,_0,_3,_1> *)local_48);
    local_d0._16_8_ =
         (gt->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_rows;
    local_d0._8_8_ =
         (gt->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_data +
         local_d0._16_8_ * (long)pPVar4;
    local_d0._0_8_ = local_70;
    local_b0.m_value = (long)gt;
    local_a8.m_value = 0;
    local_90 = local_78;
    local_a0 = pPVar4;
    local_98 = (RhsNested)local_d0._16_8_;
    Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
    _set_noalias<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,3,3,0,3,3>const>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,1,true>const,Eigen::Matrix<double,3,1,0,3,1>const>,0>>
              (local_48,(DenseBase<Eigen::Product<Eigen::Transpose<const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_0>_>
                         *)local_d0);
    std::
    vector<Eigen::Matrix<double,3,1,0,3,1>,Eigen::aligned_allocator<Eigen::Matrix<double,3,1,0,3,1>>>
    ::emplace_back<Eigen::Matrix<double,3,1,0,3,1>>
              ((vector<Eigen::Matrix<double,3,1,0,3,1>,Eigen::aligned_allocator<Eigen::Matrix<double,3,1,0,3,1>>>
                *)points2,(Matrix<double,_3,_1,_0,_3,_1> *)local_48);
    if (0.0 < noise) {
      lVar6 = *(long *)this;
      generateRandomTranslation((Vector3d *)local_48,noise);
      local_d0._0_8_ = (non_const_type)(lVar6 + lVar5);
      local_d0._8_8_ = local_48;
      Eigen::internal::
      call_assignment<Eigen::Matrix<double,3,1,0,3,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::Matrix<double,3,1,0,3,1>const>>
                ((Matrix<double,_3,_1,_0,_3,_1> *)(*(long *)this + lVar5),
                 (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
                  *)local_d0);
      pMVar1 = (points2->
               super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      generateRandomTranslation((Vector3d *)local_48,noise);
      this = local_80;
      local_d0._0_8_ =
           (rotation_t *)
           ((long)&(pMVar1->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
                   m_data + lVar5);
      local_d0._8_8_ = local_48;
      Eigen::internal::
      call_assignment<Eigen::Matrix<double,3,1,0,3,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::Matrix<double,3,1,0,3,1>const>>
                ((Matrix<double,_3,_1,_0,_3,_1> *)
                 ((long)&(((points2->
                           super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                           )._M_impl.super__Vector_impl_data._M_start)->
                         super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
                         m_data + lVar5),
                 (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
                  *)local_d0);
    }
    pPVar3 = (PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *)
             (gt->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_cols
    ;
    lVar5 = lVar5 + 0x18;
  }
  auVar2 = vcvtusi2sd_avx512f(in_XMM2,local_68);
  lVar6 = 0;
  auVar8._8_8_ = 0;
  auVar8._0_8_ = auVar2._0_8_ * local_60;
  auVar2 = vroundsd_avx(auVar8,auVar8,9);
  lVar5 = vcvttsd2usi_avx512f(auVar2);
  while (bVar7 = lVar5 != 0, lVar5 = lVar5 + -1, bVar7) {
    generateRandomPoint((Vector3d *)local_48,8.0,4.0);
    local_d0._0_8_ = local_70;
    local_d0._16_8_ = local_78;
    local_d0._8_8_ = local_48;
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,3,1,0,3,1>,Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,3,3,0,3,3>const>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::Matrix<double,3,1,0,3,1>const>,0>>
              ((Matrix<double,_3,_1,_0,_3,_1> *)
               ((long)&(((points2->
                         super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                         )._M_impl.super__Vector_impl_data._M_start)->
                       super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
                       m_data + lVar6),
               (Product<Eigen::Transpose<const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_0>
                *)local_d0);
    lVar6 = lVar6 + 0x18;
  }
  return;
}

Assistant:

void
opengv::generateRandom3D3DCorrespondences(
    const translation_t & position1,
    const rotation_t & rotation1,
    const translation_t & position2,
    const rotation_t & rotation2,
    size_t numberPoints,
    double noise,
    double outlierFraction,
    bearingVectors_t & points1,
    bearingVectors_t & points2,
    Eigen::MatrixXd & gt )
{
  //initialize point-cloud
  double minDepth = 4;
  double maxDepth = 8;

  for( size_t i = 0; i < (size_t) gt.cols(); i++ )
    gt.col(i) = generateRandomPoint( maxDepth, minDepth );

  //create the 3D-3D correspondences
  for( size_t i = 0; i < (size_t) gt.cols(); i++ )
  {
    //transform the points into the frames and store
    points1.push_back(rotation1.transpose()*(gt.col(i) - position1));
    points2.push_back(rotation2.transpose()*(gt.col(i) - position2));

    //add noise
    if( noise > 0.0 )
    {
      points1[i] = points1[i] + generateRandomTranslation(noise);
      points2[i] = points2[i] + generateRandomTranslation(noise);
    }
  }

  //add outliers
  size_t numberOutliers = (size_t) floor(outlierFraction*numberPoints);
  for(size_t i = 0; i < numberOutliers; i++)
  {
    //generate a random point
    point_t p = generateRandomPoint(8,4);

    //push-back in frame 2 only to create outlier
    points2[i] = rotation2.transpose()*(p - position2);
  }
}